

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encrypt.c
# Opt level: O0

void HPDF_Encrypt_CreateOwnerKey(HPDF_Encrypt attr)

{
  byte local_1f8 [8];
  HPDF_BYTE new_key [16];
  uint local_1e0;
  uint local_1dc;
  HPDF_UINT j;
  HPDF_UINT i_1;
  HPDF_BYTE tmppwd2 [32];
  uint local_1ac;
  HPDF_BYTE local_1a8 [4];
  HPDF_UINT i;
  HPDF_BYTE tmppwd [32];
  HPDF_BYTE digest [16];
  undefined1 local_16c [8];
  HPDF_MD5_CTX md5_ctx;
  HPDF_ARC4_Ctx_Rec rc4_ctx;
  HPDF_Encrypt attr_local;
  
  HPDF_MD5Init((HPDF_MD5Context *)local_16c);
  HPDF_MD5Update((HPDF_MD5Context *)local_16c,attr->owner_passwd,0x20);
  HPDF_MD5Final(tmppwd + 0x18,(HPDF_MD5Context *)local_16c);
  if (attr->mode == HPDF_ENCRYPT_R3) {
    for (local_1ac = 0; local_1ac < 0x32; local_1ac = local_1ac + 1) {
      HPDF_MD5Init((HPDF_MD5Context *)local_16c);
      HPDF_MD5Update((HPDF_MD5Context *)local_16c,tmppwd + 0x18,attr->key_len);
      HPDF_MD5Final(tmppwd + 0x18,(HPDF_MD5Context *)local_16c);
    }
  }
  ARC4Init((HPDF_ARC4_Ctx_Rec *)(md5_ctx.in + 0x3a),tmppwd + 0x18,attr->key_len);
  ARC4CryptBuf((HPDF_ARC4_Ctx_Rec *)(md5_ctx.in + 0x3a),attr->user_passwd,local_1a8,0x20);
  if (attr->mode == HPDF_ENCRYPT_R3) {
    for (local_1dc = 1; local_1dc < 0x14; local_1dc = local_1dc + 1) {
      for (local_1e0 = 0; local_1e0 < attr->key_len; local_1e0 = local_1e0 + 1) {
        local_1f8[local_1e0] = tmppwd[(ulong)local_1e0 + 0x18] ^ (byte)local_1dc;
      }
      HPDF_MemCpy((HPDF_BYTE *)&j,local_1a8,0x20);
      ARC4Init((HPDF_ARC4_Ctx_Rec *)(md5_ctx.in + 0x3a),local_1f8,attr->key_len);
      ARC4CryptBuf((HPDF_ARC4_Ctx_Rec *)(md5_ctx.in + 0x3a),(HPDF_BYTE *)&j,local_1a8,0x20);
    }
  }
  HPDF_MemCpy(attr->owner_key,local_1a8,0x20);
  return;
}

Assistant:

void
HPDF_Encrypt_CreateOwnerKey  (HPDF_Encrypt  attr)
{
    HPDF_ARC4_Ctx_Rec rc4_ctx;
    HPDF_MD5_CTX md5_ctx;
    HPDF_BYTE digest[HPDF_MD5_KEY_LEN];
    HPDF_BYTE tmppwd[HPDF_PASSWD_LEN];

    HPDF_PTRACE((" HPDF_Encrypt_CreateOwnerKey\n"));

    /* create md5-digest using the value of owner_passwd */

    /* Algorithm 3.3 step 2 */
    HPDF_MD5Init(&md5_ctx);
    HPDF_MD5Update(&md5_ctx, attr->owner_passwd, HPDF_PASSWD_LEN);

    HPDF_PTRACE(("@ Algorithm 3.3 step 2\n"));

    HPDF_MD5Final(digest, &md5_ctx);

    /* Algorithm 3.3 step 3 (Revision 3 only) */
    if (attr->mode == HPDF_ENCRYPT_R3) {
        HPDF_UINT i;

        for (i = 0; i < 50; i++) {
            HPDF_MD5Init(&md5_ctx);

            /* HPDF_MD5Update (&md5_ctx, digest, HPDF_MD5_KEY_LEN); */
            HPDF_MD5Update (&md5_ctx, digest, attr->key_len);
            HPDF_MD5Final(digest, &md5_ctx);

            HPDF_PTRACE(("@ Algorithm 3.3 step 3 loop %u\n", i));
        }
    }

    /* Algorithm 3.3 step 4 */
    HPDF_PTRACE(("@ Algorithm 3.3 step 7 loop 0\n"));

    ARC4Init (&rc4_ctx, digest, attr->key_len);

    HPDF_PTRACE(("@ Algorithm 3.3 step 5\n"));

    /* Algorithm 3.3 step 6 */
    HPDF_PTRACE(("@ Algorithm 3.3 step 6\n"));
    ARC4CryptBuf (&rc4_ctx, attr->user_passwd, tmppwd, HPDF_PASSWD_LEN);

    /* Algorithm 3.3 step 7 */
    HPDF_PTRACE(("@ Algorithm 3.3 step 7\n"));
    if (attr->mode == HPDF_ENCRYPT_R3) {
        HPDF_BYTE tmppwd2[HPDF_PASSWD_LEN];
        HPDF_UINT i;

        for (i = 1; i <= 19; i++) {
            HPDF_UINT j;
            HPDF_BYTE new_key[HPDF_MD5_KEY_LEN];

            for (j = 0; j < attr->key_len; j++)
                new_key[j] = (HPDF_BYTE)(digest[j] ^ i);

            HPDF_PTRACE(("@ Algorithm 3.3 step 7 loop %u\n", i));

            HPDF_MemCpy (tmppwd2, tmppwd, HPDF_PASSWD_LEN);
            ARC4Init(&rc4_ctx, new_key, attr->key_len);
            ARC4CryptBuf(&rc4_ctx, tmppwd2, tmppwd, HPDF_PASSWD_LEN);
        }
    }

    /* Algorithm 3.3 step 8 */
    HPDF_PTRACE(("@ Algorithm 3.3 step 8\n"));
    HPDF_MemCpy (attr->owner_key, tmppwd, HPDF_PASSWD_LEN);
}